

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetDefaultVector
               (HelicsInput inp,double *vectorInput,int vectorLength,HelicsError *err)

{
  InputObject *pIVar1;
  int in_EDX;
  Input *in_RSI;
  InputObject *inpObj;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  Input *val;
  Input *in_stack_ffffffffffffff60;
  HelicsInput in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *this;
  allocator_type *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffff68,(HelicsError *)in_stack_ffffffffffffff60);
  if (pIVar1 != (InputObject *)0x0) {
    if ((in_RSI == (Input *)0x0) || (in_EDX < 1)) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1d0389);
      helics::Input::setDefault<std::vector<double,std::allocator<double>>>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff70);
    }
    else {
      val = pIVar1->inputPtr;
      this = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff8f;
      std::allocator<double>::allocator((allocator<double> *)0x1d0403);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      helics::Input::setDefault<std::vector<double,std::allocator<double>>>
                (in_RSI,(vector<double,_std::allocator<double>_> *)val);
      std::vector<double,_std::allocator<double>_>::~vector(this);
      std::allocator<double>::~allocator((allocator<double> *)&stack0xffffffffffffff8f);
    }
  }
  return;
}

Assistant:

void helicsInputSetDefaultVector(HelicsInput inp, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            inpObj->inputPtr->setDefault(std::vector<double>{});
        } else {
            inpObj->inputPtr->setDefault(std::vector<double>(vectorInput, vectorInput + vectorLength));
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}